

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<Strider> * __thiscall
pybind11::class_<Strider>::def_readwrite<Strider,bool>
          (class_<Strider> *this,char *name,offset_in_Link_to_long pm)

{
  cpp_function *in_RDX;
  handle *in_RDI;
  cpp_function fset;
  cpp_function fget;
  is_method *in_stack_ffffffffffffffb0;
  is_method in_stack_ffffffffffffffb8;
  cpp_function *in_stack_ffffffffffffffc0;
  cpp_function *in_stack_ffffffffffffffc8;
  is_method in_stack_ffffffffffffffd0;
  cpp_function *name_00;
  class_<Strider> *in_stack_ffffffffffffffe0;
  
  name_00 = in_RDX;
  is_method::is_method((is_method *)&stack0xffffffffffffffd0,in_RDI);
  cpp_function::
  cpp_function<pybind11::class_<Strider>::def_readwrite<Strider,bool>(char_const*,bool_Strider::*)::_lambda(Strider_const&)_1_,pybind11::is_method,void>
            (in_stack_ffffffffffffffc0,(type *)in_stack_ffffffffffffffb8.class_.m_ptr,
             in_stack_ffffffffffffffb0);
  is_method::is_method((is_method *)&stack0xffffffffffffffb8,in_RDI);
  cpp_function::
  cpp_function<pybind11::class_<Strider>::def_readwrite<Strider,bool>(char_const*,bool_Strider::*)::_lambda(Strider&,bool_const&)_1_,pybind11::is_method,void>
            (in_RDX,(type *)in_stack_ffffffffffffffb8.class_.m_ptr,in_stack_ffffffffffffffb0);
  def_property<pybind11::return_value_policy>
            (in_stack_ffffffffffffffe0,(char *)name_00,
             (cpp_function *)in_stack_ffffffffffffffd0.class_.m_ptr,in_stack_ffffffffffffffc8,
             (return_value_policy *)in_RDX);
  cpp_function::~cpp_function((cpp_function *)0x287c58);
  cpp_function::~cpp_function((cpp_function *)0x287c62);
  return (class_<Strider> *)in_RDI;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra&... extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value, "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D &{ return c.*pm; }, is_method(*this)),
                     fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }